

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O1

void __thiscall
helics::apps::Recorder::loadJsonFile
          (Recorder *this,string *jsonString,bool enableFederateInterfaceRegistration)

{
  _Map_pointer ppIVar1;
  _Map_pointer ppEVar2;
  _Map_pointer ppEVar3;
  _Elt_pointer pEVar4;
  bool bVar5;
  int iVar6;
  Input *__args;
  ulong uVar7;
  Endpoint *pEVar8;
  string *psVar9;
  mapped_type *pmVar10;
  reference pvVar11;
  reference pbVar12;
  _Elt_pointer pIVar13;
  _Elt_pointer pEVar14;
  int iVar15;
  string_view key;
  string_view sourceEndpoint;
  string_view destEndpoint;
  string_view sourceEndpoint_00;
  string_view destEndpoint_00;
  string_view key_00;
  string_view sourceEndpoint_01;
  string_view destEndpoint_01;
  string_view sourceEndpoint_02;
  string_view destEndpoint_02;
  iterator __begin3;
  iterator __end3;
  value_type clones;
  value_type captures;
  value_type destClone;
  value_type sourceClone;
  value_type tags;
  json doc;
  string local_118;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_f8;
  long *local_d8;
  size_t local_d0;
  long local_c8 [2];
  _Rb_tree_node_base local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  data local_58;
  string *local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"recorder","");
  apps::App::loadJsonFileConfiguration
            (&this->super_App,&local_118,jsonString,enableFederateInterfaceRegistration);
  local_48 = jsonString;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  iVar6 = helics::ValueFederate::getInputCount
                    (&((this->super_App).fed.
                       super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_ValueFederate);
  if (0 < iVar6) {
    local_b8._M_right = (_Base_ptr)&this->subscriptions;
    local_b8._M_left = (_Base_ptr)&this->targets;
    iVar15 = 0;
    do {
      __args = helics::ValueFederate::getInput
                         (&((this->super_App).fed.
                            super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->super_ValueFederate,iVar15);
      std::deque<helics::Input,std::allocator<helics::Input>>::emplace_back<helics::Input&>
                ((deque<helics::Input,std::allocator<helics::Input>> *)local_b8._M_right,__args);
      pIVar13 = (this->subscriptions).
                super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      if (pIVar13 ==
          (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        pIVar13 = (this->subscriptions).
                  super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node[-1] + 1;
      }
      if (pIVar13[-1].givenTarget._M_string_length == 0) {
        psVar9 = Interface::getSourceTargets_abi_cxx11_(&pIVar13[-1].super_Interface);
      }
      else {
        psVar9 = (string *)&pIVar13[-1].givenTarget;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 local_b8._M_left,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar9);
      pIVar13 = (this->subscriptions).
                super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      uVar7 = (long)pIVar13 -
              (long)(this->subscriptions).
                    super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first;
      if (uVar7 == 0) {
        pIVar13 = (this->subscriptions).
                  super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node[-1] + 1;
      }
      local_118._M_dataplus._M_p._0_4_ = pIVar13[-1].super_Interface.handle.hid;
      ppIVar1 = (this->subscriptions).
                super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      local_f8.m_object =
           (pointer)CONCAT44(local_f8.m_object._4_4_,
                             (int)((ulong)((long)(this->subscriptions).
                                                 super__Deque_base<helics::Input,_std::allocator<helics::Input>_>
                                                 ._M_impl.super__Deque_impl_data._M_start._M_last -
                                          (long)(this->subscriptions).
                                                super__Deque_base<helics::Input,_std::allocator<helics::Input>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_cur) >>
                                  4) * 0x286bca1b +
                             (int)((ulong)((long)ppIVar1 -
                                          (long)(this->subscriptions).
                                                super__Deque_base<helics::Input,_std::allocator<helics::Input>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_node) >>
                                  3) + (int)(uVar7 >> 4) * 0x286bca1b +
                                       (uint)(ppIVar1 == (_Map_pointer)0x0) + -2);
      std::
      _Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,int>,std::_Select1st<std::pair<helics::InterfaceHandle_const,int>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,int>>>
      ::_M_emplace_unique<helics::InterfaceHandle,int>
                ((_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,int>,std::_Select1st<std::pair<helics::InterfaceHandle_const,int>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,int>>>
                  *)&this->subids,(InterfaceHandle *)&local_118,(int *)&local_f8);
      pIVar13 = (this->subscriptions).
                super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      if (pIVar13 ==
          (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        pIVar13 = (this->subscriptions).
                  super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node[-1] + 1;
      }
      if (pIVar13[-1].givenTarget._M_string_length == 0) {
        psVar9 = Interface::getSourceTargets_abi_cxx11_(&pIVar13[-1].super_Interface);
      }
      else {
        psVar9 = (string *)&pIVar13[-1].givenTarget;
      }
      ppIVar1 = (this->subscriptions).
                super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      local_118._M_dataplus._M_p._0_4_ =
           (int)((ulong)((long)(this->subscriptions).
                               super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_last -
                        (long)(this->subscriptions).
                              super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
                              _M_impl.super__Deque_impl_data._M_start._M_cur) >> 4) * 0x286bca1b +
           (int)((ulong)((long)(this->subscriptions).
                               super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
                               _M_impl.super__Deque_impl_data._M_finish._M_cur -
                        (long)(this->subscriptions).
                              super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
                              _M_impl.super__Deque_impl_data._M_finish._M_first) >> 4) * 0x286bca1b
           + (int)((ulong)((long)ppIVar1 -
                          (long)(this->subscriptions).
                                super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
                                _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) +
             (uint)(ppIVar1 == (_Map_pointer)0x0) + -2;
      std::
      _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,int>
                ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>
                  *)&this->subkeys,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar9,
                 (int *)&local_118);
      iVar15 = iVar15 + 1;
    } while (iVar6 != iVar15);
  }
  iVar6 = helics::MessageFederate::getEndpointCount
                    ((MessageFederate *)
                     &(((this->super_App).fed.
                        super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_ValueFederate).field_0x10);
  if (0 < iVar6) {
    local_b8._M_right = (_Base_ptr)&this->endpoints;
    local_b8._M_left = (_Base_ptr)&this->eptNames;
    iVar15 = 0;
    do {
      pEVar8 = helics::MessageFederate::getEndpoint
                         ((MessageFederate *)
                          &(((this->super_App).fed.
                             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->super_ValueFederate).field_0x10,iVar15);
      std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::emplace_back<helics::Endpoint&>
                ((deque<helics::Endpoint,std::allocator<helics::Endpoint>> *)local_b8._M_right,
                 pEVar8);
      ppEVar2 = (this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      ppEVar3 = (this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      pEVar8 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      uVar7 = (long)pEVar8 -
              (long)(this->endpoints).
                    super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first;
      if (uVar7 == 0) {
        pEVar8 = ppEVar2[-1] + 4;
      }
      pEVar14 = (this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_start._M_last;
      pEVar4 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      psVar9 = Interface::getName_abi_cxx11_(&pEVar8[-1].super_Interface);
      local_118._M_string_length = (size_type)(psVar9->_M_dataplus)._M_p;
      local_118._M_dataplus._M_p = (pointer)psVar9->_M_string_length;
      pmVar10 = CLI::std::
                map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                ::operator[]((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                              *)local_b8._M_left,(key_type *)&local_118);
      *pmVar10 = (int)((ulong)((long)pEVar14 - (long)pEVar4) >> 3) * -0x11111111 +
                 (int)(uVar7 >> 3) * -0x11111111 +
                 ((int)((ulong)((long)ppEVar2 - (long)ppEVar3) >> 3) + -1 +
                 (uint)(ppEVar2 == (_Map_pointer)0x0)) * 4 + -1;
      pEVar14 = (this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      uVar7 = (long)pEVar14 -
              (long)(this->endpoints).
                    super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first;
      if (uVar7 == 0) {
        pEVar14 = (this->endpoints).
                  super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node[-1] + 4;
      }
      local_118._M_dataplus._M_p._0_4_ = pEVar14[-1].super_Interface.handle.hid;
      ppEVar2 = (this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      local_f8.m_object =
           (pointer)CONCAT44(local_f8.m_object._4_4_,
                             (int)(uVar7 >> 3) * -0x11111111 +
                             ((int)((ulong)((long)ppEVar2 -
                                           (long)(this->endpoints).
                                                 super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>
                                                 ._M_impl.super__Deque_impl_data._M_start._M_node)
                                   >> 3) + -1 + (uint)(ppEVar2 == (_Map_pointer)0x0)) * 4 +
                             (int)((ulong)((long)(this->endpoints).
                                                 super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>
                                                 ._M_impl.super__Deque_impl_data._M_start._M_last -
                                          (long)(this->endpoints).
                                                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_cur) >>
                                  3) * -0x11111111 + -1);
      std::
      _Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,int>,std::_Select1st<std::pair<helics::InterfaceHandle_const,int>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,int>>>
      ::_M_emplace_unique<helics::InterfaceHandle,int>
                ((_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,int>,std::_Select1st<std::pair<helics::InterfaceHandle_const,int>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,int>>>
                  *)&this->eptids,(InterfaceHandle *)&local_118,(int *)&local_f8);
      iVar15 = iVar15 + 1;
    } while (iVar6 != iVar15);
  }
  fileops::loadJson((fileops *)(local_68 + 0x10),(string *)local_48);
  pvVar11 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)(local_68 + 0x10),"tag");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_68,pvVar11);
  if (local_68[0] == string) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_118,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_68);
    key._M_str = local_118._M_dataplus._M_p;
    key._M_len = local_118._M_string_length;
    addSubscription(this,key);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  else if (local_68[0] == array) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((iterator *)&local_118,
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)local_68);
    local_f8.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_f8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    local_f8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (local_68[0] == array) {
      local_f8.m_it.array_iterator._M_current =
           (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
              *)local_68._8_8_)->_M_impl).super__Vector_impl_data._M_finish;
    }
    else if (local_68[0] == object) {
      local_f8.m_it.object_iterator._M_node =
           &(((_Rep_type *)local_68._8_8_)->_M_impl).super__Rb_tree_header._M_header;
    }
    else {
      local_f8.m_it.primitive_iterator.m_it = 1;
    }
    local_f8.m_object = (pointer)local_68;
    while (bVar5 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_118,&local_f8), !bVar5) {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)&local_118);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_d8,pbVar12);
      key_00._M_str = (char *)local_d8;
      key_00._M_len = local_d0;
      addSubscription(this,key_00);
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      if (*local_118._M_dataplus._M_p == '\x02') {
        local_118.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity + 0x10;
      }
      else if (*local_118._M_dataplus._M_p == '\x01') {
        local_118._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_118._M_string_length);
      }
      else {
        local_118.field_2._8_8_ = local_118.field_2._8_8_ + 1;
      }
    }
  }
  pvVar11 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)(local_68 + 0x10),"sourceclone");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_78,pvVar11);
  if (local_78[0] == string) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_118,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_78);
    sourceEndpoint._M_str = local_118._M_dataplus._M_p;
    sourceEndpoint._M_len = local_118._M_string_length;
    addSourceEndpointClone(this,sourceEndpoint);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  else if (local_78[0] == array) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((iterator *)&local_118,
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)local_78);
    local_f8.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_f8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    local_f8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (local_78[0] == array) {
      local_f8.m_it.array_iterator._M_current =
           (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
              *)local_78._8_8_)->_M_impl).super__Vector_impl_data._M_finish;
    }
    else if (local_78[0] == object) {
      local_f8.m_it.object_iterator._M_node =
           &(((_Rep_type *)local_78._8_8_)->_M_impl).super__Rb_tree_header._M_header;
    }
    else {
      local_f8.m_it.primitive_iterator.m_it = 1;
    }
    local_f8.m_object = (pointer)local_78;
    while (bVar5 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_118,&local_f8), !bVar5) {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)&local_118);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_d8,pbVar12);
      sourceEndpoint_01._M_str = (char *)local_d8;
      sourceEndpoint_01._M_len = local_d0;
      addSourceEndpointClone(this,sourceEndpoint_01);
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      if (*local_118._M_dataplus._M_p == '\x02') {
        local_118.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity + 0x10;
      }
      else if (*local_118._M_dataplus._M_p == '\x01') {
        local_118._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_118._M_string_length);
      }
      else {
        local_118.field_2._8_8_ = local_118.field_2._8_8_ + 1;
      }
    }
  }
  pvVar11 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)(local_68 + 0x10),"destclone");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_88,pvVar11);
  if (local_88[0] == string) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_118,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_88);
    destEndpoint._M_str = local_118._M_dataplus._M_p;
    destEndpoint._M_len = local_118._M_string_length;
    addDestEndpointClone(this,destEndpoint);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  else if (local_88[0] == array) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((iterator *)&local_118,
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)local_88);
    local_f8.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_f8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    local_f8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (local_88[0] == array) {
      local_f8.m_it.array_iterator._M_current =
           (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
              *)local_88._8_8_)->_M_impl).super__Vector_impl_data._M_finish;
    }
    else if (local_88[0] == object) {
      local_f8.m_it.object_iterator._M_node =
           &(((_Rep_type *)local_88._8_8_)->_M_impl).super__Rb_tree_header._M_header;
    }
    else {
      local_f8.m_it.primitive_iterator.m_it = 1;
    }
    local_f8.m_object = (pointer)local_88;
    while (bVar5 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_118,&local_f8), !bVar5) {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)&local_118);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_d8,pbVar12);
      destEndpoint_01._M_str = (char *)local_d8;
      destEndpoint_01._M_len = local_d0;
      addDestEndpointClone(this,destEndpoint_01);
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      if (*local_118._M_dataplus._M_p == '\x02') {
        local_118.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity + 0x10;
      }
      else if (*local_118._M_dataplus._M_p == '\x01') {
        local_118._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_118._M_string_length);
      }
      else {
        local_118.field_2._8_8_ = local_118.field_2._8_8_ + 1;
      }
    }
  }
  pvVar11 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)(local_68 + 0x10),"clone");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_b8,pvVar11);
  if ((undefined1)local_b8._M_color == 3) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_118,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_b8);
    sourceEndpoint_00._M_str = local_118._M_dataplus._M_p;
    sourceEndpoint_00._M_len = local_118._M_string_length;
    addSourceEndpointClone(this,sourceEndpoint_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_118,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_b8);
    destEndpoint_00._M_str = local_118._M_dataplus._M_p;
    destEndpoint_00._M_len = local_118._M_string_length;
    addDestEndpointClone(this,destEndpoint_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  else if ((undefined1)local_b8._M_color == 2) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((iterator *)&local_118,
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)&local_b8);
    local_f8.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_f8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    local_f8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if ((undefined1)local_b8._M_color == 2) {
      local_f8.m_it.array_iterator._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            *)(local_b8._M_parent)->_M_parent;
    }
    else if ((undefined1)local_b8._M_color == _S_black) {
      local_f8.m_it.object_iterator._M_node = (_Base_ptr)&(local_b8._M_parent)->_M_parent;
    }
    else {
      local_f8.m_it.primitive_iterator.m_it = 1;
    }
    local_f8.m_object = (pointer)&local_b8;
    while (bVar5 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_118,&local_f8), !bVar5) {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)&local_118);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_d8,pbVar12);
      sourceEndpoint_02._M_str = (char *)local_d8;
      sourceEndpoint_02._M_len = local_d0;
      addSourceEndpointClone(this,sourceEndpoint_02);
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_d8,pbVar12);
      destEndpoint_02._M_str = (char *)local_d8;
      destEndpoint_02._M_len = local_d0;
      addDestEndpointClone(this,destEndpoint_02);
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      if (*local_118._M_dataplus._M_p == '\x02') {
        local_118.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity + 0x10;
      }
      else if (*local_118._M_dataplus._M_p == '\x01') {
        local_118._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_118._M_string_length);
      }
      else {
        local_118.field_2._8_8_ = local_118.field_2._8_8_ + 1;
      }
    }
  }
  pvVar11 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)(local_68 + 0x10),"capture");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_98,pvVar11);
  if (local_98[0] == string) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_118,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_98);
    local_f8.m_object = (pointer)local_118._M_string_length;
    local_f8.m_it.object_iterator._M_node = (_Base_ptr)local_118._M_dataplus._M_p;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->captureInterfaces,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  else if (local_98[0] == array) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((iterator *)&local_118,
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)local_98);
    local_f8.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_f8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    local_f8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (local_98[0] == array) {
      local_f8.m_it.array_iterator._M_current =
           (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
              *)local_98._8_8_)->_M_impl).super__Vector_impl_data._M_finish;
    }
    else if (local_98[0] == object) {
      local_f8.m_it.object_iterator._M_node =
           &(((_Rep_type *)local_98._8_8_)->_M_impl).super__Rb_tree_header._M_header;
    }
    else {
      local_f8.m_it.primitive_iterator.m_it = 1;
    }
    local_f8.m_object = (pointer)local_98;
    while (bVar5 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_118,&local_f8), !bVar5) {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)&local_118);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_d8,pbVar12);
      local_40._M_len = local_d0;
      local_40._M_str = (char *)local_d8;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->captureInterfaces,&local_40);
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      if (*local_118._M_dataplus._M_p == '\x02') {
        local_118.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity + 0x10;
      }
      else if (*local_118._M_dataplus._M_p == '\x01') {
        local_118._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_118._M_string_length);
      }
      else {
        local_118.field_2._8_8_ = local_118.field_2._8_8_ + 1;
      }
    }
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)local_98);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)&local_b8);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)local_88);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)local_78);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)local_68);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)(local_68 + 0x10));
  return;
}

Assistant:

void Recorder::loadJsonFile(const std::string& jsonString, bool enableFederateInterfaceRegistration)
{
    loadJsonFileConfiguration("recorder", jsonString, enableFederateInterfaceRegistration);

    auto subCount = fed->getInputCount();
    for (int ii = 0; ii < subCount; ++ii) {
        subscriptions.emplace_back(fed->getInput(ii));
        targets.emplace_back(subscriptions.back().getTarget());
        subids.emplace(subscriptions.back().getHandle(),
                       static_cast<int>(subscriptions.size()) - 1);
        subkeys.emplace(subscriptions.back().getTarget(),
                        static_cast<int>(subscriptions.size()) - 1);
    }
    auto eptCount = fed->getEndpointCount();
    for (int ii = 0; ii < eptCount; ++ii) {
        endpoints.emplace_back(fed->getEndpoint(ii));
        eptNames[endpoints.back().getName()] = static_cast<int>(endpoints.size() - 1);
        eptids.emplace(endpoints.back().getHandle(), static_cast<int>(endpoints.size() - 1));
    }

    auto doc = fileops::loadJson(jsonString);

    auto tags = doc["tag"];
    if (tags.is_array()) {
        for (const auto& tag : tags) {
            addSubscription(tag.get<std::string>());
        }
    } else if (tags.is_string()) {
        addSubscription(tags.get<std::string>());
    }
    auto sourceClone = doc["sourceclone"];
    if (sourceClone.is_array()) {
        for (const auto& clone : sourceClone) {
            addSourceEndpointClone(clone.get<std::string>());
        }
    } else if (sourceClone.is_string()) {
        addSourceEndpointClone(sourceClone.get<std::string>());
    }
    auto destClone = doc["destclone"];
    if (destClone.is_array()) {
        for (const auto& clone : destClone) {
            addDestEndpointClone(clone.get<std::string>());
        }
    } else if (destClone.is_string()) {
        addDestEndpointClone(destClone.get<std::string>());
    }
    auto clones = doc["clone"];
    if (clones.is_array()) {
        for (const auto& clone : clones) {
            addSourceEndpointClone(clone.get<std::string>());
            addDestEndpointClone(clone.get<std::string>());
        }
    } else if (clones.is_string()) {
        addSourceEndpointClone(clones.get<std::string>());
        addDestEndpointClone(clones.get<std::string>());
    }
    auto captures = doc["capture"];
    if (captures.is_array()) {
        for (const auto& capture : captures) {
            addCapture(capture.get<std::string>());
        }
    } else if (captures.is_string()) {
        addCapture(captures.get<std::string>());
    }
}